

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

void EthBasePort::PrintMAC(ostream *outStr,char *name,uint8_t *addr,bool swap16)

{
  size_t sVar1;
  ostream *poVar2;
  byte *pbVar3;
  long *plVar4;
  undefined7 in_register_00000009;
  long lVar5;
  long lVar6;
  long lVar7;
  long local_38;
  
  if ((int)CONCAT71(in_register_00000009,swap16) == 0) {
    if (name == (char *)0x0) {
      std::ios::clear((int)outStr + (int)*(undefined8 *)(*(long *)outStr + -0x18));
    }
    else {
      sVar1 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(outStr,name,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(outStr,": ",2);
    lVar5 = *(long *)outStr;
    *(uint *)(outStr + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(outStr + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(outStr + *(long *)(lVar5 + -0x18) + 0x10) = 2;
    poVar2 = outStr + *(long *)(lVar5 + -0x18);
    if (outStr[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar2);
      poVar2[0xe1] = (ostream)0x1;
    }
    poVar2[0xe0] = (ostream)0x30;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)outStr,(uint)*addr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    pbVar3 = addr + 1;
    local_38 = 5;
    lVar6 = 4;
    lVar7 = 3;
    lVar5 = 2;
  }
  else {
    if (name == (char *)0x0) {
      std::ios::clear((int)outStr + (int)*(undefined8 *)(*(long *)outStr + -0x18));
    }
    else {
      sVar1 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(outStr,name,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(outStr,": ",2);
    lVar5 = *(long *)outStr;
    *(uint *)(outStr + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(outStr + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(outStr + *(long *)(lVar5 + -0x18) + 0x10) = 2;
    poVar2 = outStr + *(long *)(lVar5 + -0x18);
    if (outStr[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar2);
      poVar2[0xe1] = (ostream)0x1;
    }
    poVar2[0xe0] = (ostream)0x30;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)outStr,(uint)addr[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    local_38 = 4;
    lVar6 = 5;
    lVar5 = 3;
    lVar7 = 2;
    pbVar3 = addr;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)*pbVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)addr[lVar5]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)addr[lVar7]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)addr[lVar6]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  plVar4 = (long *)std::ostream::operator<<((ostream *)poVar2,(uint)addr[local_38]);
  lVar5 = *plVar4;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)((long)plVar4 + lVar6 + 0x18) = *(uint *)((long)plVar4 + lVar6 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar5 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return;
}

Assistant:

void EthBasePort::PrintMAC(std::ostream &outStr, const char* name, const uint8_t *addr, bool swap16)
{
    if (swap16) {
        outStr << name << ": " << std::hex << std::setw(2) << std::setfill('0')
               << (int)addr[1] << ":" << (int)addr[0] << ":" << (int)addr[3] << ":"
               << (int)addr[2] << ":" << (int)addr[5] << ":" << (int)addr[4] << std::dec << std::endl;
    }
    else {
        outStr << name << ": " << std::hex << std::setw(2) << std::setfill('0')
               << (int)addr[0] << ":" << (int)addr[1] << ":" << (int)addr[2] << ":"
               << (int)addr[3] << ":" << (int)addr[4] << ":" << (int)addr[5] << std::dec << std::endl;
    }
}